

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

common_arg * __thiscall common_arg::set_env(common_arg *this,char *env)

{
  char *in_RSI;
  common_arg *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_50 [32];
  string local_30 [32];
  char *local_10;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffff90;
  local_10 = in_RSI;
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::operator=((string *)&in_RDI->help,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  in_RDI->env = local_10;
  return in_RDI;
}

Assistant:

common_arg & common_arg::set_env(const char * env) {
    help = help + "\n(env: " + env + ")";
    this->env = env;
    return *this;
}